

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateProtoLdFldFromFlagInlineCache
          (Lowerer *this,Instr *insertBeforeInstr,Opnd *opndDst,RegOpnd *opndInlineCache,
          LabelInstr *labelFallThru,bool isInlineSlot)

{
  BYTE scale;
  DWORD offset;
  IndirOpnd *pIVar1;
  RegOpnd *pRVar2;
  RegOpnd *baseOpnd;
  undefined3 in_register_00000089;
  
  pIVar1 = IR::IndirOpnd::New(opndInlineCache,0,TyInt64,this->m_func,false);
  pRVar2 = IR::RegOpnd::New(TyInt64,this->m_func);
  InsertMove(&pRVar2->super_Opnd,&pIVar1->super_Opnd,insertBeforeInstr,false);
  baseOpnd = pRVar2;
  if (CONCAT31(in_register_00000089,isInlineSlot) == 0) {
    baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
    offset = Js::DynamicObject::GetOffsetOfAuxSlots();
    pIVar1 = IR::IndirOpnd::New(pRVar2,offset,TyInt64,this->m_func,false);
    InsertMove(&baseOpnd->super_Opnd,&pIVar1->super_Opnd,insertBeforeInstr,false);
  }
  pRVar2 = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar1 = IR::IndirOpnd::New(opndInlineCache,10,TyUint16,this->m_func,false);
  InsertMove(&pRVar2->super_Opnd,&pIVar1->super_Opnd,insertBeforeInstr,false);
  scale = LowererMDArch::GetDefaultIndirScale();
  pIVar1 = IR::IndirOpnd::New(baseOpnd,pRVar2,scale,TyInt64,this->m_func);
  InsertMove(opndDst,&pIVar1->super_Opnd,insertBeforeInstr,false);
  InsertBranch(Br,false,labelFallThru,insertBeforeInstr);
  return;
}

Assistant:

void
Lowerer::GenerateProtoLdFldFromFlagInlineCache(
    IR::Instr * insertBeforeInstr,
    IR::Opnd * opndDst,
    IR::RegOpnd * opndInlineCache,
    IR::LabelInstr * labelFallThru,
    bool isInlineSlot)
{
    // Generate:
    //
    // s1 = MOV [&(inlineCache->u.accessor.object)] -- load the cached prototype object
    // s1 = MOV [&s1->slots] -- load the slot array
    // s2 = MOVZXW [&(inlineCache->u.accessor.slotIndex)] -- load the cached slot index
    // dst = MOV [s1 + s2*4]
    //      JMP $fallthru

    IR::Opnd* inlineCacheObjOpnd;
    IR::IndirOpnd * opndIndir;
    IR::RegOpnd * opndObjSlots = nullptr;

    inlineCacheObjOpnd = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.accessor.object), TyMachReg, this->m_func);

    // s1 = MOV [&(inlineCache->u.accessor.object)] -- load the cached prototype object
    IR::RegOpnd *opndObject = IR::RegOpnd::New(TyMachReg, this->m_func);
    InsertMove(opndObject, inlineCacheObjOpnd, insertBeforeInstr, false);

    if (!isInlineSlot)
    {
        // s1 = MOV [&s1->slots] -- load the slot array
        opndObjSlots = IR::RegOpnd::New(TyMachReg, this->m_func);
        opndIndir = IR::IndirOpnd::New(opndObject, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachReg, this->m_func);
        InsertMove(opndObjSlots, opndIndir, insertBeforeInstr, false);
    }

    // s2 = MOVZXW [&(inlineCache->u.accessor.slotIndex)] -- load the cached slot index
    IR::RegOpnd *opndSlotIndex = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::Opnd* slotIndexOpnd = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.accessor.slotIndex), TyUint16, this->m_func);
    InsertMove(opndSlotIndex, slotIndexOpnd, insertBeforeInstr, false);

    if (isInlineSlot)
    {
        // dst = MOV [s1 + s2*4]
        opndIndir = IR::IndirOpnd::New(opndObject, opndSlotIndex, m_lowererMD.GetDefaultIndirScale(), TyMachReg, this->m_func);
    }
    else
    {
        // dst = MOV [s1 + s2*4]
        opndIndir = IR::IndirOpnd::New(opndObjSlots, opndSlotIndex, m_lowererMD.GetDefaultIndirScale(), TyMachReg, this->m_func);
    }
    InsertMove(opndDst, opndIndir, insertBeforeInstr, false);

    // JMP $fallthru
    InsertBranch(Js::OpCode::Br, labelFallThru, insertBeforeInstr);
}